

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O0

void __thiscall HighsLpRelaxation::storeBasis(HighsLpRelaxation *this)

{
  HighsBasis *pHVar1;
  shared_ptr<const_HighsBasis> *in_RDI;
  HighsBasis *in_stack_00000008;
  shared_ptr<HighsBasis> *in_stack_ffffffffffffffd8;
  
  if (((ulong)in_RDI[0x537].super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    pHVar1 = Highs::getBasis((Highs *)&(in_RDI->
                                       super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_refcount);
    if ((pHVar1->valid & 1U) != 0) {
      Highs::getBasis((Highs *)&(in_RDI->
                                super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>).
                                _M_refcount);
      std::make_shared<HighsBasis,HighsBasis_const&>(in_stack_00000008);
      std::shared_ptr<HighsBasis_const>::operator=(in_RDI,in_stack_ffffffffffffffd8);
      std::shared_ptr<HighsBasis>::~shared_ptr((shared_ptr<HighsBasis> *)0x618f0a);
      *(undefined1 *)
       &in_RDI[0x537].super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = 1;
    }
  }
  return;
}

Assistant:

void storeBasis() {
    if (!currentbasisstored && lpsolver.getBasis().valid) {
      basischeckpoint = std::make_shared<HighsBasis>(lpsolver.getBasis());
      currentbasisstored = true;
    }
  }